

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.cpp
# Opt level: O1

string * __thiscall
MinVR::VRSearchPath::getFullFilenames
          (string *__return_storage_ptr__,VRSearchPath *this,string *desiredFile)

{
  string *psVar1;
  long *plVar2;
  long *plVar3;
  _List_node_base *p_Var4;
  string out;
  long *local_98;
  long local_88;
  long lStack_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  p_Var4 = (this->_searchPath).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_58 = __return_storage_ptr__;
  if (p_Var4 != (_List_node_base *)&this->_searchPath) {
    do {
      (**this->_vptr_VRSearchPath)(local_50,this,desiredFile,p_Var4 + 1);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_88 = *plVar3;
        lStack_80 = plVar2[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar3;
        local_98 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&this->_searchPath);
  }
  psVar1 = local_58;
  std::__cxx11::string::substr((ulong)local_58,(ulong)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return psVar1;
}

Assistant:

std::string VRSearchPath::getFullFilenames(const std::string &desiredFile) const {

    std::string out;
    for (std::list<std::string>::const_iterator it = _searchPath.begin();
         it != _searchPath.end(); it++)
        out += _selectFile(desiredFile, (*it)) + ":";

    return out.substr(0, out.length() - 1);
}